

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O0

void mwrite(memfile *mf,void *buf,uint num)

{
  bool bVar1;
  char *pcVar2;
  uint local_1c;
  boolean do_realloc;
  uint num_local;
  void *buf_local;
  memfile *mf_local;
  
  bVar1 = false;
  while ((uint)mf->len < mf->pos + num) {
    mf->len = mf->len + 0x1000;
    bVar1 = true;
  }
  if (bVar1) {
    pcVar2 = (char *)realloc(mf->buf,(long)mf->len);
    mf->buf = pcVar2;
  }
  memcpy(mf->buf + mf->pos,buf,(ulong)num);
  local_1c = num;
  if (mf->relativeto == (memfile *)0x0) {
    mf->pos = num + mf->pos;
  }
  else {
    while (local_1c != 0) {
      if ((mf->relativepos < mf->relativeto->pos) &&
         (mf->buf[mf->pos] == mf->relativeto->buf[mf->relativepos])) {
        if ((mf->curcmd != MDIFF_COPY) || (0x3ffe < mf->curcount)) {
          mdiffflush(mf);
          mf->curcount = 0;
        }
        mf->curcmd = MDIFF_COPY;
        mf->curcount = mf->curcount + 1;
      }
      else {
        if ((mf->curcmd != MDIFF_EDIT) || (0x3ffe < mf->curcount)) {
          mdiffflush(mf);
          mf->curcount = 0;
        }
        mf->curcmd = MDIFF_EDIT;
        mf->curcount = mf->curcount + 1;
      }
      mf->pos = mf->pos + 1;
      mf->relativepos = mf->relativepos + 1;
      local_1c = local_1c - 1;
    }
  }
  return;
}

Assistant:

void mwrite(struct memfile *mf, const void *buf, unsigned int num)
{
	boolean do_realloc = FALSE;
	while (mf->len < mf->pos + num) {
	    mf->len += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->buf = realloc(mf->buf, mf->len);
	memcpy(&mf->buf[mf->pos], buf, num);

	if (!mf->relativeto) {
	    mf->pos += num;
	} else {
	    /* calculate and record the diff as well */
	    while (num--) {
		if (mf->relativepos < mf->relativeto->pos &&
		    mf->buf[mf->pos] == mf->relativeto->buf[mf->relativepos]) {
		    if (mf->curcmd != MDIFF_COPY || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_COPY;
		    mf->curcount++;
		} else {
		    /*
		     * Note that mdiffflush is responsible for writing the
		     * actual data that was edited, once we have a complete
		     * run of it. So there's no need to record the data
		     * anywhere but in buf.
		     */
		    if (mf->curcmd != MDIFF_EDIT || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_EDIT;
		    mf->curcount++;
		}
		mf->pos++;
		mf->relativepos++;
	    }
	}
}